

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logger_impl.h
# Opt level: O0

void __thiscall spdlog::logger::flush_on(logger *this,level_enum log_level)

{
  undefined4 in_ESI;
  long in_RDI;
  memory_order __b;
  
  std::operator&(memory_order_seq_cst,__memory_order_mask);
  LOCK();
  *(undefined4 *)(in_RDI + 0x44) = in_ESI;
  UNLOCK();
  return;
}

Assistant:

inline void spdlog::logger::flush_on(level::level_enum log_level)
{
    flush_level_.store(log_level);
}